

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint64_t __thiscall kratos::HashVisitor::produce_hash(HashVisitor *this)

{
  size_type sVar1;
  pointer input;
  ulong *puVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_type sVar6;
  
  sVar1 = (this->root_->name)._M_string_length;
  if (sVar1 == 0) {
    uVar4 = 0x8422232500000000;
  }
  else {
    uVar5 = 0xcbf29ce484222325;
    sVar6 = 0;
    do {
      uVar3 = (byte)(this->root_->name)._M_dataplus._M_p[sVar6] ^ uVar5;
      uVar5 = uVar3 * 0x100000001b3;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
    uVar4 = uVar3 * 0x1b300000000;
  }
  for (puVar2 = (this->var_hashes_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 != (this->var_hashes_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    uVar4 = uVar4 ^ *puVar2;
  }
  input = (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start;
  uVar4 = XXHash64::hash(input,(long)(this->stmt_hashes_).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)input,uVar4)
  ;
  return uVar4;
}

Assistant:

uint64_t produce_hash() {
        // use generator name as a seed
        uint64_t var_hash = hash_64_fnv1a(root_->name.c_str(), root_->name.size()) << 32u;
        for (const uint64_t var : var_hashes_) var_hash = var_hash ^ var;
        // use var_hash as a seed
        // FIXME: do we really need to hash in chunks? or can we use xor to ignore the ordering
        //  of the blocks?
        uint64_t result =
            XXHash64::hash(stmt_hashes_.data(), stmt_hashes_.size() * sizeof(uint64_t), var_hash);
        return result;
    }